

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

longlong __thiscall QPDFObjectHandle::getIntValue(QPDFObjectHandle *this)

{
  QPDF_Integer *pQVar1;
  longlong lVar2;
  string local_38;
  
  pQVar1 = ::qpdf::BaseHandle::as<QPDF_Integer>(&this->super_BaseHandle);
  if (pQVar1 == (QPDF_Integer *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"returning 0","");
    typeWarning(this,"integer",&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    lVar2 = 0;
  }
  else {
    lVar2 = pQVar1->val;
  }
  return lVar2;
}

Assistant:

long long
QPDFObjectHandle::getIntValue() const
{
    if (auto integer = as<QPDF_Integer>()) {
        return integer->val;
    } else {
        typeWarning("integer", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle integer returning 0");
        return 0;
    }
}